

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::EndTable(void)

{
  ImVec2 *pIVar1;
  ImVec4 *pIVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  undefined2 uVar5;
  ImGuiTable *pIVar6;
  ImGuiWindow *window;
  ImGuiWindow *pIVar7;
  ImGuiTableTempData *pIVar8;
  ImDrawListSplitter *this;
  ImBitArrayPtr pIVar9;
  ImGuiTableColumn *pIVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  byte bVar13;
  int iVar14;
  ImGuiTableInstanceData *pIVar15;
  ImGuiTableTempData *pIVar16;
  long lVar17;
  ImDrawList *draw_list;
  ImGuiTable *pIVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  uint extraout_XMM0_Db;
  uint uVar24;
  uint extraout_XMM0_Dc;
  uint uVar25;
  uint extraout_XMM0_Dd;
  uint uVar26;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  uint uVar32;
  uint uVar33;
  ImVec2 local_38;
  
  pIVar11 = GImGui;
  pIVar6 = GImGui->CurrentTable;
  if (pIVar6->IsLayoutLocked == false) {
    TableUpdateLayout(pIVar6);
  }
  uVar32 = pIVar6->Flags;
  window = pIVar6->InnerWindow;
  pIVar7 = pIVar6->OuterWindow;
  pIVar8 = pIVar6->TempData;
  if (pIVar6->IsInsideRow == true) {
    TableEndRow(pIVar6);
  }
  if (((((uVar32 & 0x20) != 0) && (pIVar6->HoveredColumnBody != -1)) &&
      (bVar12 = IsAnyItemHovered(), !bVar12)) && (bVar12 = IsMouseReleased(1), bVar12)) {
    TableOpenContextMenu((int)pIVar6->HoveredColumnBody);
  }
  if ((long)pIVar6->InstanceCurrent == 0) {
    pIVar15 = &pIVar6->InstanceDataFirst;
  }
  else {
    pIVar15 = (pIVar6->InstanceDataExtra).Data + (long)pIVar6->InstanceCurrent + -1;
  }
  (window->DC).PrevLineSize = pIVar8->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar8->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar8->HostBackupCursorMaxPos;
  fVar30 = pIVar6->RowPosY2;
  if (window == pIVar7) {
    if ((uVar32 >> 0x11 & 1) == 0) {
      fVar31 = (pIVar6->OuterRect).Max.y;
      uVar20 = -(uint)(fVar30 <= fVar31);
      fVar31 = (float)(~uVar20 & (uint)fVar30 | (uint)fVar31 & uVar20);
      (pIVar6->InnerRect).Max.y = fVar31;
      (pIVar6->OuterRect).Max.y = fVar31;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar30;
  }
  fVar31 = (pIVar6->OuterRect).Max.y;
  fVar28 = (pIVar6->WorkRect).Max.y;
  uVar20 = -(uint)(fVar31 <= fVar28);
  (pIVar6->WorkRect).Max.y = (float)(~uVar20 & (uint)fVar31 | (uint)fVar28 & uVar20);
  pIVar15->LastOuterHeight = fVar31 - (pIVar6->OuterRect).Min.y;
  if (((uint)pIVar6->Flags >> 0x18 & 1) != 0) {
    fVar31 = (pIVar6->InnerWindow->DC).CursorMaxPos.x;
    if ((long)pIVar6->RightMostEnabledColumn != -1) {
      fVar28 = 0.0;
      if (((uint)pIVar6->Flags >> 10 & 1) != 0) {
        fVar28 = 1.0;
      }
      fVar28 = ((pIVar6->Columns).Data[pIVar6->RightMostEnabledColumn].WorkMaxX +
                pIVar6->CellPaddingX + pIVar6->OuterPaddingX) - fVar28;
      uVar20 = -(uint)(fVar28 <= fVar31);
      fVar31 = (float)(uVar20 & (uint)fVar31 | ~uVar20 & (uint)fVar28);
    }
    if (pIVar6->ResizedColumn != -1) {
      uVar20 = -(uint)(pIVar6->ResizeLockMinContentsX2 <= fVar31);
      fVar31 = (float)((uint)fVar31 & uVar20 | ~uVar20 & (uint)pIVar6->ResizeLockMinContentsX2);
    }
    (pIVar6->InnerWindow->DC).CursorMaxPos.x = fVar31 + pIVar6->TempData->AngledHeadersExtraWidth;
  }
  if ((uVar32 >> 0x14 & 1) == 0) {
    ImDrawList::PopClipRect(window->DrawList);
  }
  draw_list = window->DrawList;
  pIVar2 = (draw_list->_ClipRectStack).Data + (long)(draw_list->_ClipRectStack).Size + -1;
  fVar31 = pIVar2->y;
  fVar28 = pIVar2->z;
  fVar29 = pIVar2->w;
  (window->ClipRect).Min.x = pIVar2->x;
  (window->ClipRect).Min.y = fVar31;
  (window->ClipRect).Max.x = fVar28;
  (window->ClipRect).Max.y = fVar29;
  if ((uVar32 & 0x780) != 0) {
    TableDrawBorders(pIVar6);
    draw_list = window->DrawList;
  }
  this = pIVar6->DrawSplitter;
  ImDrawListSplitter::SetCurrentChannel(this,draw_list,0);
  if ((pIVar6->Flags & 0x100000) == 0) {
    TableMergeDrawChannels(pIVar6);
  }
  ImDrawListSplitter::Merge(this,window->DrawList);
  iVar14 = pIVar6->ColumnsCount;
  if ((long)iVar14 < 1) {
    fVar31 = 0.0;
    fVar28 = 0.0;
    fVar29 = 0.0;
  }
  else {
    pIVar9 = pIVar6->EnabledMaskByIndex;
    fVar29 = 0.0;
    lVar17 = 0x18;
    uVar19 = 0;
    fVar28 = 0.0;
    fVar31 = 0.0;
    uVar32 = 0;
    uVar20 = 0;
    uVar33 = 0;
    do {
      if ((pIVar9[uVar19 >> 5 & 0x7ffffff] >> ((uint)uVar19 & 0x1f) & 1) != 0) {
        pIVar10 = (pIVar6->Columns).Data;
        uVar21 = *(uint *)((long)pIVar10 + lVar17 + -0x18);
        if ((uVar21 & 0x30) == 0x10) {
          fVar22 = *(float *)((long)pIVar10 + lVar17 + -8);
          uVar24 = 0;
          uVar25 = 0;
          uVar26 = 0;
        }
        else {
          fVar22 = TableGetColumnWidthAuto
                             (pIVar6,(ImGuiTableColumn *)((long)pIVar10 + lVar17 + -0x18));
          uVar24 = extraout_XMM0_Db;
          uVar25 = extraout_XMM0_Dc;
          uVar26 = extraout_XMM0_Dd;
        }
        if ((uVar21 & 0x10) == 0) {
          fVar28 = fVar28 + fVar22;
        }
        else {
          fVar29 = fVar29 + fVar22;
        }
        if ((~uVar21 & 0x28) == 0) {
          fVar22 = fVar22 / (*(float *)((long)&pIVar10->Flags + lVar17) /
                            pIVar6->ColumnsStretchSumWeights);
          uVar21 = -(uint)(fVar22 <= fVar31);
          auVar27._0_4_ = uVar21 & (uint)fVar31;
          auVar27._4_4_ = uVar24 & uVar32;
          auVar27._8_4_ = uVar25 & uVar20;
          auVar27._12_4_ = uVar26 & uVar33;
          auVar27 = auVar27 | ZEXT416(~uVar21 & (uint)fVar22);
          fVar31 = auVar27._0_4_;
          uVar32 = auVar27._4_4_;
          uVar20 = auVar27._8_4_;
          uVar33 = auVar27._12_4_;
        }
      }
      uVar19 = uVar19 + 1;
      lVar17 = lVar17 + 0x70;
    } while ((long)iVar14 != uVar19);
  }
  fVar22 = pIVar6->CellPaddingX + pIVar6->CellPaddingX;
  pIVar6->ColumnsAutoFitWidth =
       (float)(~-(uint)(fVar31 <= fVar28) & (uint)fVar31 | (uint)fVar28 & -(uint)(fVar31 <= fVar28))
       + (float)(int)pIVar6->ColumnsEnabledCount * fVar22 +
         pIVar6->OuterPaddingX + pIVar6->OuterPaddingX +
         (float)(pIVar6->ColumnsEnabledCount + -1) * (pIVar6->CellSpacingX1 + pIVar6->CellSpacingX2)
         + fVar29;
  if ((window == pIVar7) || ((pIVar6->Flags & 0x1000000U) != 0)) {
    if ((((long)pIVar6->LastResizedColumn != -1) &&
        ((pIVar6->ResizedColumn == -1 && (window->ScrollbarX == true)))) &&
       (pIVar6->InstanceInteracted == pIVar6->InstanceCurrent)) {
      fVar22 = fVar22 + pIVar6->MinColumnWidth;
      fVar31 = (pIVar6->Columns).Data[pIVar6->LastResizedColumn].MaxX;
      if ((pIVar6->InnerClipRect).Min.x <= fVar31) {
        pIVar1 = &(pIVar6->InnerClipRect).Max;
        if (fVar31 < pIVar1->x || fVar31 == pIVar1->x) goto LAB_001b0063;
        fVar22 = fVar22 + (fVar31 - (window->Pos).x);
      }
      else {
        fVar22 = (fVar31 - (window->Pos).x) - fVar22;
      }
      SetScrollFromPosX(window,fVar22,1.0);
    }
  }
  else {
    (window->Scroll).x = 0.0;
  }
LAB_001b0063:
  if (((long)pIVar6->ResizedColumn != -1) && (pIVar6->InstanceCurrent == pIVar6->InstanceInteracted)
     ) {
    pIVar6->ResizedColumnNextWidth =
         (float)(int)(((((float)(int)(pIVar11->CurrentDpiScale * 4.0) +
                        ((pIVar11->IO).MousePos.x - (pIVar11->ActiveIdClickOffset).x)) -
                       (pIVar6->Columns).Data[pIVar6->ResizedColumn].MinX) - pIVar6->CellSpacingX1)
                     - (pIVar6->CellPaddingX + pIVar6->CellPaddingX));
  }
  if (pIVar11->ActiveIdIsAlive == 0) {
    bVar13 = false;
  }
  else {
    bVar13 = pIVar6->IsActiveIdAliveBeforeTable ^ 1;
  }
  pIVar6->IsActiveIdInTable = (bool)bVar13;
  if (0 < pIVar6->InstanceCurrent) {
    PopID();
  }
  PopID();
  fVar31 = (pIVar7->DC).CursorMaxPos.x;
  fVar28 = (pIVar7->DC).CursorMaxPos.y;
  IVar3 = (pIVar8->HostBackupWorkRect).Max;
  (window->WorkRect).Min = (pIVar8->HostBackupWorkRect).Min;
  (window->WorkRect).Max = IVar3;
  IVar3 = (pIVar8->HostBackupParentWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar8->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = IVar3;
  window->SkipItems = pIVar6->HostSkipItems;
  (pIVar7->DC).CursorPos = (pIVar6->OuterRect).Min;
  (pIVar7->DC).ItemWidth = pIVar8->HostBackupItemWidth;
  (pIVar7->DC).ItemWidthStack.Size = pIVar8->HostBackupItemWidthStackSize;
  (pIVar7->DC).ColumnsOffset.x = (pIVar8->HostBackupColumnsOffset).x;
  if (window == pIVar7) {
    IVar3 = (pIVar6->OuterRect).Min;
    IVar4 = (pIVar6->OuterRect).Max;
    local_38.x = IVar4.x - IVar3.x;
    local_38.y = IVar4.y - IVar3.y;
    ItemSize(&local_38,-1.0);
    ItemAdd(&pIVar6->OuterRect,0,(ImRect *)0x0,0);
  }
  else {
    uVar5 = (window->DC).NavLayersActiveMask;
    (window->DC).NavLayersActiveMask = uVar5 | 1;
    EndChild();
    (window->DC).NavLayersActiveMask = uVar5;
  }
  uVar32 = pIVar6->Flags;
  if ((uVar32 >> 0x10 & 1) == 0) {
    fVar29 = (pIVar8->UserOuterSize).x;
    fVar22 = 0.0;
    if (fVar29 <= 0.0) {
      if ((uVar32 >> 0x19 & 1) != 0) {
        fVar22 = (window->ScrollbarSizes).x;
      }
      fVar23 = (pIVar6->OuterRect).Min.x + pIVar6->ColumnsAutoFitWidth +
               pIVar6->TempData->AngledHeadersExtraWidth + fVar22;
      fVar22 = (pIVar7->DC).IdealMaxPos.x;
      fVar29 = fVar23 - fVar29;
      uVar20 = -(uint)(fVar29 <= fVar22);
      (pIVar7->DC).IdealMaxPos.x = (float)(uVar20 & (uint)fVar22 | ~uVar20 & (uint)fVar29);
      fVar29 = (pIVar6->OuterRect).Max.x;
      if (fVar23 <= fVar29) {
        fVar29 = fVar23;
      }
    }
    else {
      fVar29 = (pIVar6->OuterRect).Max.x;
    }
  }
  else {
    fVar29 = (pIVar6->OuterRect).Min.x + pIVar6->ColumnsAutoFitWidth;
  }
  uVar20 = -(uint)(fVar29 <= fVar31);
  (pIVar7->DC).CursorMaxPos.x = (float)(~uVar20 & (uint)fVar29 | (uint)fVar31 & uVar20);
  fVar31 = (pIVar8->UserOuterSize).y;
  fVar29 = 0.0;
  if (fVar31 <= 0.0) {
    if ((uVar32 >> 0x18 & 1) != 0) {
      fVar29 = (window->ScrollbarSizes).y;
    }
    fVar22 = (pIVar7->DC).IdealMaxPos.y;
    fVar30 = fVar30 + fVar29;
    fVar31 = fVar30 - fVar31;
    uVar32 = -(uint)(fVar31 <= fVar22);
    (pIVar7->DC).IdealMaxPos.y = (float)(uVar32 & (uint)fVar22 | ~uVar32 & (uint)fVar31);
    fVar31 = (pIVar6->OuterRect).Max.y;
    if (fVar30 <= fVar31) {
      fVar31 = fVar30;
    }
  }
  else {
    fVar31 = (pIVar6->OuterRect).Max.y;
  }
  uVar32 = -(uint)(fVar31 <= fVar28);
  (pIVar7->DC).CursorMaxPos.y = (float)(~uVar32 & (uint)fVar31 | (uint)fVar28 & uVar32);
  if (pIVar6->IsSettingsDirty == true) {
    TableSaveSettings(pIVar6);
  }
  pIVar6->IsInitializing = false;
  lVar17 = (long)pIVar11->TablesTempDataStacked;
  pIVar11->TablesTempDataStacked = pIVar11->TablesTempDataStacked + -1;
  if (lVar17 < 2) {
LAB_001b03c9:
    pIVar11->CurrentTable = (ImGuiTable *)0x0;
  }
  else {
    pIVar8 = (pIVar11->TablesTempData).Data;
    pIVar16 = pIVar8 + lVar17 + -2;
    if (pIVar16 == (ImGuiTableTempData *)0x0) goto LAB_001b03c9;
    iVar14 = pIVar16->TableIndex;
    pIVar6 = (pIVar11->Tables).Buf.Data;
    pIVar18 = pIVar6 + iVar14;
    pIVar11->CurrentTable = pIVar18;
    if (pIVar6 != (ImGuiTable *)0x0) {
      pIVar18->TempData = pIVar16;
      pIVar18->DrawSplitter = &pIVar8[lVar17 + -2].DrawSplitter;
      goto LAB_001b03da;
    }
  }
  iVar14 = -1;
LAB_001b03da:
  (pIVar7->DC).CurrentTableIdx = iVar14;
  NavUpdateCurrentWindowIsScrollPushableX();
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    ImGuiTableTempData* temp_data = table->TempData;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    inner_window->DC.PrevLineSize = temp_data->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = temp_data->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = temp_data->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table_instance->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x + table->TempData->AngledHeadersExtraWidth;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    ImDrawListSplitter* splitter = table->DrawSplitter;
    splitter->SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    splitter->Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    float auto_fit_width_for_fixed = 0.0f;
    float auto_fit_width_for_stretched = 0.0f;
    float auto_fit_width_for_stretched_min = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (IM_BITARRAY_TESTBIT(table->EnabledMaskByIndex, column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            float column_width_request = ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize)) ? column->WidthRequest : TableGetColumnWidthAuto(table, column);
            if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
                auto_fit_width_for_fixed += column_width_request;
            else
                auto_fit_width_for_stretched += column_width_request;
            if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) && (column->Flags & ImGuiTableColumnFlags_NoResize) != 0)
                auto_fit_width_for_stretched_min = ImMax(auto_fit_width_for_stretched_min, column_width_request / (column->StretchWeight / table->ColumnsStretchSumWeights));
        }
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount + auto_fit_width_for_fixed + ImMax(auto_fit_width_for_stretched, auto_fit_width_for_stretched_min);

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + ImTrunc(TABLE_RESIZE_SEPARATOR_HALF_THICKNESS * g.CurrentDpiScale));
        const float new_width = ImTrunc(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    table->IsActiveIdInTable = (g.ActiveIdIsAlive != 0 && table->IsActiveIdAliveBeforeTable == false);

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table_instance->TableInstanceID, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    if (table->InstanceCurrent > 0)
        PopID();
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = temp_data->HostBackupWorkRect;
    inner_window->ParentWorkRect = temp_data->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = temp_data->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = temp_data->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = temp_data->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        short backup_nav_layers_active_mask = inner_window->DC.NavLayersActiveMask;
        inner_window->DC.NavLayersActiveMask |= 1 << ImGuiNavLayer_Main; // So empty table don't appear to navigate differently.
        EndChild();
        inner_window->DC.NavLayersActiveMask = backup_nav_layers_active_mask;
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (temp_data->UserOuterSize.x <= 0.0f)
    {
        // Some references for this: #7651 + tests "table_reported_size", "table_reported_size_outer" equivalent Y block
        // - Checking for ImGuiTableFlags_ScrollX/ScrollY flag makes us a frame ahead when disabling those flags.
        // - FIXME-TABLE: Would make sense to pre-compute expected scrollbar visibility/sizes to generally save a frame of feedback.
        const float inner_content_max_x = table->OuterRect.Min.x + table->ColumnsAutoFitWidth; // Slightly misleading name but used for code symmetry with inner_content_max_y
        const float decoration_size = table->TempData->AngledHeadersExtraWidth + ((table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.x : 0.0f);
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, inner_content_max_x + decoration_size - temp_data->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, inner_content_max_x + decoration_size));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (temp_data->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - temp_data->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y + decoration_size));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    IM_ASSERT(g.TablesTempDataStacked > 0);
    temp_data = (--g.TablesTempDataStacked > 0) ? &g.TablesTempData[g.TablesTempDataStacked - 1] : NULL;
    g.CurrentTable = temp_data ? g.Tables.GetByIndex(temp_data->TableIndex) : NULL;
    if (g.CurrentTable)
    {
        g.CurrentTable->TempData = temp_data;
        g.CurrentTable->DrawSplitter = &temp_data->DrawSplitter;
    }
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
    NavUpdateCurrentWindowIsScrollPushableX();
}